

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinImporter::ReadBinaryCamera(AssbinImporter *this,IOStream *stream,aiCamera *cam)

{
  uint uVar1;
  runtime_error *this_00;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 local_438;
  ai_uint32 local_428;
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 == 0x1234) {
    Read<unsigned_int>(stream);
    Read<aiString>((aiString *)&stack0xfffffffffffffbd8,stream);
    if ((aiCamera *)&stack0xfffffffffffffbd8 != cam) {
      (cam->mName).length = local_428;
      memcpy((cam->mName).data,&stack0xfffffffffffffbdc,(ulong)_local_428 & 0xffffffff);
      (cam->mName).data[(ulong)_local_428 & 0xffffffff] = '\0';
    }
    fVar2 = Read<float>(stream);
    fVar3 = Read<float>(stream);
    fVar4 = Read<float>(stream);
    (cam->mPosition).x = fVar2;
    (cam->mPosition).y = fVar3;
    (cam->mPosition).z = fVar4;
    fVar2 = Read<float>(stream);
    fVar3 = Read<float>(stream);
    fVar4 = Read<float>(stream);
    (cam->mLookAt).x = fVar2;
    (cam->mLookAt).y = fVar3;
    (cam->mLookAt).z = fVar4;
    fVar2 = Read<float>(stream);
    fVar3 = Read<float>(stream);
    fVar4 = Read<float>(stream);
    (cam->mUp).x = fVar2;
    (cam->mUp).y = fVar3;
    (cam->mUp).z = fVar4;
    fVar2 = Read<float>(stream);
    cam->mHorizontalFOV = fVar2;
    fVar2 = Read<float>(stream);
    cam->mClipPlaneNear = fVar2;
    fVar2 = Read<float>(stream);
    cam->mClipPlaneFar = fVar2;
    fVar2 = Read<float>(stream);
    cam->mAspect = fVar2;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  _local_428 = &stack0xfffffffffffffbe8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffbd8,"Magic chunk identifiers are wrong!","");
  std::runtime_error::runtime_error(this_00,(string *)&stack0xfffffffffffffbd8);
  *(undefined ***)this_00 = &PTR__runtime_error_00896c98;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryCamera( IOStream * stream, aiCamera* cam ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AICAMERA)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    cam->mName = Read<aiString>(stream);
    cam->mPosition = Read<aiVector3D>(stream);
    cam->mLookAt = Read<aiVector3D>(stream);
    cam->mUp = Read<aiVector3D>(stream);
    cam->mHorizontalFOV = Read<float>(stream);
    cam->mClipPlaneNear = Read<float>(stream);
    cam->mClipPlaneFar = Read<float>(stream);
    cam->mAspect = Read<float>(stream);
}